

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmissionSystem.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::DATA_TYPE::EmissionSystem::operator==(EmissionSystem *this,EmissionSystem *Value)

{
  pointer pEVar1;
  KBOOL KVar2;
  pointer this_00;
  pointer Value_00;
  
  if ((((this->m_ui8SystemDataLength == Value->m_ui8SystemDataLength) &&
       (this->m_ui8NumberOfBeams == Value->m_ui8NumberOfBeams)) &&
      (KVar2 = EmitterSystem::operator!=(&this->m_EmitterSystemRecord,&Value->m_EmitterSystemRecord)
      , !KVar2)) && (KVar2 = Vector::operator!=(&this->m_Location,&Value->m_Location), !KVar2)) {
    this_00 = (this->m_vEmitterBeams).
              super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pEVar1 = (this->m_vEmitterBeams).
             super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->m_vEmitterBeams).
               super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pEVar1 - (long)this_00 ==
        (long)(Value->m_vEmitterBeams).
              super__Vector_base<KDIS::DATA_TYPE::EmitterBeam,_std::allocator<KDIS::DATA_TYPE::EmitterBeam>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pEVar1) {
        return true;
      }
      do {
        KVar2 = EmitterBeam::operator==(this_00,Value_00);
        if (!KVar2) break;
        this_00 = this_00 + 1;
        Value_00 = Value_00 + 1;
      } while (this_00 != pEVar1);
      if (KVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL EmissionSystem::operator == ( const EmissionSystem & Value ) const
{
    if( m_ui8SystemDataLength   != Value.m_ui8SystemDataLength )    return false;
    if( m_ui8NumberOfBeams      != Value.m_ui8NumberOfBeams )       return false;
    if( m_EmitterSystemRecord   != Value.m_EmitterSystemRecord )    return false;
    if( m_Location              != Value.m_Location )               return false;
    if( m_vEmitterBeams         != Value.m_vEmitterBeams )          return false;
    return true;
}